

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

void __thiscall Js::CompoundString::Grow(CompoundString *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Block **ppBVar4;
  JavascriptLibrary *pJVar5;
  Recycler *pRVar6;
  Block *pBVar7;
  Block *newLastBlock;
  Block *lastBlock;
  CompoundString *this_local;
  
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3b1,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = OwnsLastBlock(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3b2,"(OwnsLastBlock())","OwnsLastBlock()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_Block__((WriteBarrierPtr *)&this->lastBlock);
  pBVar7 = *ppBVar4;
  if (pBVar7 == (Block *)0x0) {
    pJVar5 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    pRVar6 = JavascriptLibrary::GetRecycler(pJVar5);
    pBVar7 = BlockInfo::Resize(&this->lastBlockInfo,pRVar6);
    Memory::WriteBarrierPtr<Js::CompoundString::Block>::operator=(&this->lastBlock,pBVar7);
  }
  else {
    BlockInfo::CopyTo(&this->lastBlockInfo,pBVar7);
    pJVar5 = RecyclableObject::GetLibrary((RecyclableObject *)this);
    pRVar6 = JavascriptLibrary::GetRecycler(pJVar5);
    pBVar7 = Block::Chain(pBVar7,pRVar6);
    BlockInfo::CopyFrom(&this->lastBlockInfo,pBVar7);
    Memory::WriteBarrierPtr<Js::CompoundString::Block>::operator=(&this->lastBlock,pBVar7);
  }
  return;
}

Assistant:

void CompoundString::Grow()
    {
        Assert(!IsFinalized());
        Assert(OwnsLastBlock());

        Block *const lastBlock = this->lastBlock;
        if(!lastBlock)
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. In that case it is always
            // within the threshold to resize. Resize the buffer or resize it into a new block depending on its size.
            this->lastBlock = lastBlockInfo.Resize(GetLibrary()->GetRecycler());
            return;
        }

        lastBlockInfo.CopyTo(lastBlock);
        Block *const newLastBlock = lastBlock->Chain(GetLibrary()->GetRecycler());
        lastBlockInfo.CopyFrom(newLastBlock);
        this->lastBlock = newLastBlock;
    }